

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O3

Ref<anurbs::BrepEdge>
anurbs::PythonDataType<anurbs::Model,_anurbs::BrepEdge>::add_with_attributes
          (Model *self,Pointer<anurbs::BrepEdge> *data,string *attributes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Ref<anurbs::BrepEdge> RVar2;
  _Alloc_hider local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_18._M_p = (attributes->_M_dataplus)._M_p;
  local_10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)attributes->_M_string_length;
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_10->_M_use_count = local_10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_10->_M_use_count = local_10->_M_use_count + 1;
    }
  }
  RVar2 = Model::add<anurbs::BrepEdge>(self,data,(string *)&stack0xffffffffffffffe8);
  _Var1._M_pi = RVar2.m_entry.
                super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    _Var1._M_pi = extraout_RDX;
  }
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)self;
  return (Ref<anurbs::BrepEdge>)
         RVar2.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> add_with_attributes(TModel& self, Pointer<TData> data,
        const std::string& attributes)
    {
        return self.template add<TData>(data, attributes);
    }